

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

bool __thiscall
kj::Function<bool_(capnp::MessageBuilder_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1765:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1765:35)>
             *this,MessageBuilder *params)

{
  uint *puVar1;
  DebugExpression<bool> _kjCondition_1;
  Fault f;
  Reader desc;
  Reader call;
  Reader message;
  Reader capTable;
  Fault local_108;
  DebugComparison<unsigned_int,_unsigned_int_&> local_100;
  undefined1 local_d8 [32];
  uint local_b8;
  Reader local_a8;
  Reader local_78;
  ListReader local_48;
  
  capnp::MessageBuilder::getRoot<capnp::rpc::Message>((Builder *)&local_a8,params);
  capnp::_::StructBuilder::asReader((StructBuilder *)&local_a8);
  if ((0xf < local_78._reader.dataSize) && (*local_78._reader.data == 2)) {
    capnp::rpc::Message::Reader::getCall(&local_a8,&local_78);
    if ((0x7f < local_a8._reader.dataSize) &&
       ((*(long *)((long)local_a8._reader.data + 8) == -0x2238f40687becc31 &&
        (*(short *)((long)local_a8._reader.data + 4) == 0)))) {
      capnp::rpc::Call::Reader::getParams((Reader *)local_d8,&local_a8);
      capnp::rpc::Payload::Reader::getCapTable((Reader *)&local_48,(Reader *)local_d8);
      local_d8._0_4_ = local_48.elementCount;
      local_d8._4_4_ = 1;
      local_d8._8_8_ = " == ";
      local_d8._16_8_ = &DAT_00000005;
      local_d8[0x18] = local_48.elementCount == 1;
      if (!local_d8[0x18]) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                  ((Fault *)&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x6ee,FAILED,"capTable.size() == 1","_kjCondition,",
                   (DebugComparison<unsigned_int,_int> *)local_d8);
        kj::_::Debug::Fault::fatal((Fault *)&local_100);
      }
      capnp::_::ListReader::getStructElement((StructReader *)local_d8,&local_48,0);
      if (*(this->f).exportIsPromise == true) {
        if (local_b8 < 0x10) {
          local_108.exception._0_1_ = false;
LAB_001ebc5b:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&local_100,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f1,FAILED,"desc.isSenderPromise()","_kjCondition,",
                     (DebugExpression<bool> *)&local_108);
          kj::_::Debug::Fault::fatal((Fault *)&local_100);
        }
        local_108.exception._0_1_ = *(short *)local_d8._16_8_ == 2;
        if (!(bool)local_108.exception._0_1_) goto LAB_001ebc5b;
        local_100.left = 0;
        if (0x3f < local_b8) {
          local_100.left = *(uint32_t *)(local_d8._16_8_ + 4);
        }
        local_100.right = (this->f).expectedExportNumber;
        local_100.result = local_100.left == *local_100.right;
        local_100.op.content.ptr = " == ";
        local_100.op.content.size_ = 5;
        if (!local_100.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                    (&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f2,FAILED,"desc.getSenderPromise() == expectedExportNumber","_kjCondition,"
                     ,&local_100);
          kj::_::Debug::Fault::fatal(&local_108);
        }
      }
      else {
        if (local_b8 < 0x10) {
          local_108.exception._0_1_ = false;
LAB_001ebc9a:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&local_100,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f4,FAILED,"desc.isSenderHosted()","_kjCondition,",
                     (DebugExpression<bool> *)&local_108);
          kj::_::Debug::Fault::fatal((Fault *)&local_100);
        }
        local_108.exception._0_1_ = *(short *)local_d8._16_8_ == 1;
        if (!(bool)local_108.exception._0_1_) goto LAB_001ebc9a;
        local_100.left = 0;
        if (0x3f < local_b8) {
          local_100.left = *(uint32_t *)(local_d8._16_8_ + 4);
        }
        local_100.right = (this->f).expectedExportNumber;
        local_100.result = local_100.left == *local_100.right;
        local_100.op.content.ptr = " == ";
        local_100.op.content.size_ = 5;
        if (!local_100.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                    (&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f5,FAILED,"desc.getSenderHosted() == expectedExportNumber","_kjCondition,",
                     &local_100);
          kj::_::Debug::Fault::fatal(&local_108);
        }
      }
      puVar1 = (this->f).interceptCount;
      *puVar1 = *puVar1 + 1;
    }
  }
  return true;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }